

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseDataBase<QList<QString>,void(QList<QString>const&)>::
reject<QtPromisePrivate::PromiseError_const&>
          (PromiseDataBase<QList<QString>,void(QList<QString>const&)> *this,PromiseError *error)

{
  PromiseError local_20;
  PromiseError *local_18;
  PromiseError *error_local;
  PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)> *this_local;
  
  local_18 = error;
  error_local = (PromiseError *)this;
  PromiseError::PromiseError(&local_20,error);
  PromiseError::operator=((PromiseError *)(this + 0x50),&local_20);
  PromiseError::~PromiseError(&local_20);
  PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>::setSettled
            ((PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)> *)this);
  return;
}

Assistant:

void reject(E&& error)
    {
        Q_ASSERT(isPending());
        Q_ASSERT(m_error.isNull());
        m_error = PromiseError{std::forward<E>(error)};
        setSettled();
    }